

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

optional<int> __thiscall ear::Layout::indexForName(Layout *this,string *name)

{
  Channel *pCVar1;
  bool bVar2;
  type tVar3;
  long lVar4;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  __it;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  _Var5;
  string *local_38;
  
  __it._M_current =
       (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
       super__Vector_impl_data._M_start;
  pCVar1 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl
           .super__Vector_impl_data._M_finish;
  lVar4 = ((long)pCVar1 - (long)__it._M_current >> 4) * -0x71c71c71c71c71c7 >> 2;
  local_38 = name;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                          *)&local_38,__it);
      _Var5._M_current = __it._M_current;
      if (bVar2) goto LAB_00148295;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                          *)&local_38,__it._M_current + 1);
      _Var5._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_00148295;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                          *)&local_38,__it._M_current + 2);
      _Var5._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_00148295;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                          *)&local_38,__it._M_current + 3);
      _Var5._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_00148295;
      __it._M_current = __it._M_current + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = ((long)pCVar1 - (long)__it._M_current >> 4) * -0x71c71c71c71c71c7;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var5._M_current = pCVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::
                  operator()((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                              *)&local_38,__it), _Var5._M_current = __it._M_current, bVar2))
      goto LAB_00148295;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::operator()
                      ((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0>
                        *)&local_38,__it);
    _Var5._M_current = __it._M_current;
    if (bVar2) goto LAB_00148295;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::$_0>::operator()
                    ((_Iter_pred<ear::Layout::indexForName(std::__cxx11::string_const&)const::__0> *
                     )&local_38,__it);
  _Var5._M_current = pCVar1;
  if (bVar2) {
    _Var5._M_current = __it._M_current;
  }
LAB_00148295:
  if (_Var5._M_current ==
      (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    tVar3.m_initialized = false;
    tVar3._1_3_ = 0;
    tVar3.m_storage = 0;
  }
  else {
    tVar3 = (type)(((ulong)((long)_Var5._M_current -
                           (long)(this->_channels).
                                 super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 4) *
                   0x38e38e3900000000 + 1);
  }
  return (optional<int>)tVar3;
}

Assistant:

boost::optional<int> Layout::indexForName(const std::string& name) const {
    auto it = std::find_if(
        _channels.begin(), _channels.end(),
        [&name](const Channel c) -> bool { return c.name() == name; });
    if (it != _channels.end()) {
      return static_cast<int>(std::distance(_channels.begin(), it));
    } else {
      return boost::none;
    }
  }